

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_001614e0;
  AssertionResult::AssertionResult(&this->assertionResult,&param_1->assertionResult);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  sVar1 = (param_1->totals).assertions.passed;
  sVar2 = (param_1->totals).assertions.failed;
  sVar3 = (param_1->totals).testCases.failed;
  (this->totals).testCases.passed = (param_1->totals).testCases.passed;
  (this->totals).testCases.failed = sVar3;
  (this->totals).assertions.passed = sVar1;
  (this->totals).assertions.failed = sVar2;
  return;
}

Assistant:

AssertionStats( AssertionResult const& _assertionResult,
                        std::vector<MessageInfo> const& _infoMessages,
                        Totals const& _totals )
        :   assertionResult( _assertionResult ),
            infoMessages( _infoMessages ),
            totals( _totals )
        {
            if( assertionResult.hasMessage() ) {
                // Copy message into messages list.
                // !TBD This should have been done earlier, somewhere
                MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
                builder << assertionResult.getMessage();
                builder.m_info.message = builder.m_stream.str();

                infoMessages.push_back( builder.m_info );
            }
        }